

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O2

void * alloc_large(j_common_ptr cinfo,int pool_id,size_t sizeofobject)

{
  size_t sizeofobject_00;
  jpeg_memory_mgr *pjVar1;
  jpeg_error_mgr *pjVar2;
  _func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *p_Var3;
  ulong uVar4;
  
  pjVar1 = cinfo->mem;
  if (0xffe8 < sizeofobject) {
    *(undefined8 *)&cinfo->err->msg_code = 0x300000038;
    (*cinfo->err->error_exit)(cinfo);
  }
  uVar4 = sizeofobject + 7 & 0xfffffffffffffff8;
  if (1 < (uint)pool_id) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0xf;
    (pjVar2->msg_parm).i[0] = pool_id;
    (*cinfo->err->error_exit)(cinfo);
  }
  sizeofobject_00 = uVar4 + 0x18;
  p_Var3 = (_func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *)
           jpeg_get_large(cinfo,sizeofobject_00);
  if (p_Var3 == (_func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *)0x0) {
    *(undefined8 *)&cinfo->err->msg_code = 0x400000038;
    (*cinfo->err->error_exit)(cinfo);
  }
  pjVar1[1].realize_virt_arrays = pjVar1[1].realize_virt_arrays + sizeofobject_00;
  *(_func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION **)p_Var3 =
       (&pjVar1[1].alloc_sarray)[pool_id];
  *(ulong *)(p_Var3 + 8) = uVar4;
  *(undefined8 *)(p_Var3 + 0x10) = 0;
  (&pjVar1[1].alloc_sarray)[pool_id] = p_Var3;
  return p_Var3 + 0x18;
}

Assistant:

METHODDEF(void FAR *)
alloc_large (j_common_ptr cinfo, int pool_id, size_t sizeofobject)
/* Allocate a "large" object */
{
  my_mem_ptr mem = (my_mem_ptr) cinfo->mem;
  large_pool_ptr hdr_ptr;
  size_t odd_bytes;

  /* Check for unsatisfiable request (do now to ensure no overflow below) */
  if (sizeofobject > (size_t) (MAX_ALLOC_CHUNK-SIZEOF(large_pool_hdr)))
    out_of_memory(cinfo, 3);	/* request exceeds malloc's ability */

  /* Round up the requested size to a multiple of SIZEOF(ALIGN_TYPE) */
  odd_bytes = sizeofobject % SIZEOF(ALIGN_TYPE);
  if (odd_bytes > 0)
    sizeofobject += SIZEOF(ALIGN_TYPE) - odd_bytes;

  /* Always make a new pool */
  if (pool_id < 0 || pool_id >= JPOOL_NUMPOOLS)
    ERREXIT1(cinfo, JERR_BAD_POOL_ID, pool_id);	/* safety check */

  hdr_ptr = (large_pool_ptr) jpeg_get_large(cinfo, sizeofobject +
					    SIZEOF(large_pool_hdr));
  if (hdr_ptr == NULL)
    out_of_memory(cinfo, 4);	/* jpeg_get_large failed */
  mem->total_space_allocated += sizeofobject + SIZEOF(large_pool_hdr);

  /* Success, initialize the new pool header and add to list */
  hdr_ptr->hdr.next = mem->large_list[pool_id];
  /* We maintain space counts in each pool header for statistical purposes,
   * even though they are not needed for allocation.
   */
  hdr_ptr->hdr.bytes_used = sizeofobject;
  hdr_ptr->hdr.bytes_left = 0;
  mem->large_list[pool_id] = hdr_ptr;

  return (void FAR *) (hdr_ptr + 1); /* point to first data byte in pool */
}